

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O2

void __thiscall
cnn::ShadowLookupParameters::ShadowLookupParameters
          (ShadowLookupParameters *this,LookupParameters *lp)

{
  pointer pTVar1;
  long *plVar2;
  uint uVar3;
  float *pfVar4;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__range1;
  Tensor *t;
  pointer d;
  
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&this->h,&lp->values);
  pTVar1 = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (d = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start; d != pTVar1; d = d + 1) {
    plVar2 = *(long **)(default_device + 0x10);
    uVar3 = Dim::size(&d->d);
    pfVar4 = (float *)(**(code **)(*plVar2 + 0x10))(plVar2,(ulong)uVar3 << 2);
    d->v = pfVar4;
    TensorTools::Zero(d);
  }
  return;
}

Assistant:

ShadowLookupParameters::ShadowLookupParameters(const LookupParameters& lp) : h(lp.values) {
  for (auto& t : h) {
    t.v = (float*)default_device->mem->malloc(t.d.size() * sizeof(float));
    TensorTools::Zero(t);
  }
}